

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AppendIPOLinkerFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *config,
          string *lang)

{
  bool bVar1;
  TargetType TVar2;
  cmValue cVar3;
  string *o;
  pointer pbVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  cmList flagsList;
  string name;
  
  bVar1 = cmGeneratorTarget::IsIPOEnabled(target,lang,config);
  if (bVar1) {
    TVar2 = cmGeneratorTarget::GetType(target);
    if ((TVar2 < OBJECT_LIBRARY) && (TVar2 != STATIC_LIBRARY)) {
      std::operator+(&bStack_78,"CMAKE_",lang);
      std::operator+(&name,&bStack_78,"_LINK_OPTIONS_IPO");
      std::__cxx11::string::~string((string *)&bStack_78);
      cVar3 = cmMakefile::GetDefinition(this->Makefile,&name);
      if (cVar3.Value != (string *)0x0) {
        std::__cxx11::string::string((string *)&bStack_78,(string *)cVar3.Value);
        init._M_len = 1;
        init._M_array = &bStack_78;
        cmList::cmList(&flagsList,init);
        std::__cxx11::string::~string((string *)&bStack_78);
        for (pbVar4 = flagsList.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar4 != flagsList.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
          (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[9])(this,flags,pbVar4);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&flagsList.Values);
      }
      std::__cxx11::string::~string((string *)&name);
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendIPOLinkerFlags(std::string& flags,
                                            cmGeneratorTarget* target,
                                            const std::string& config,
                                            const std::string& lang)
{
  if (!target->IsIPOEnabled(lang, config)) {
    return;
  }

  switch (target->GetType()) {
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      break;
    default:
      return;
  }

  const std::string name = "CMAKE_" + lang + "_LINK_OPTIONS_IPO";
  cmValue rawFlagsList = this->Makefile->GetDefinition(name);
  if (!rawFlagsList) {
    return;
  }

  cmList flagsList{ *rawFlagsList };
  for (std::string const& o : flagsList) {
    this->AppendFlagEscape(flags, o);
  }
}